

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_luma_subsampling_422_hbd_ssse3
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  __m128i *palVar2;
  int in_ECX;
  __m128i *in_RDX;
  __m128i *extraout_RDX;
  int iVar3;
  longlong in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  undefined1 auVar4 [16];
  __m128i a;
  __m128i sum_1;
  __m128i top_3;
  __m128i top_2;
  __m128i sum_3;
  __m128i top_1;
  __m128i sum_2;
  __m128i top_4;
  __m128i sum;
  __m128i top;
  __m128i *end;
  __m128i *pred_buf_m128i;
  longlong local_258;
  longlong lStack_250;
  longlong local_228;
  longlong lStack_220;
  longlong local_208;
  __m128i *local_1c0;
  undefined1 (*local_1a0) [16];
  
  iVar3 = (int)in_RSI;
  palVar2 = in_RDX + (in_R8D << 2);
  local_1c0 = in_RDX;
  local_1a0 = in_RDI;
  do {
    if (in_ECX == 4) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)*local_1a0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)*local_1a0;
      auVar4 = phaddw(auVar1,auVar4);
      psllw(auVar4,ZEXT416(2));
      a[1] = (longlong)in_RDX;
      a[0] = in_RSI;
      _mm_storeh_epi32(local_1c0,a);
      in_RDX = extraout_RDX;
    }
    else if (in_ECX == 8) {
      auVar4 = phaddw(*local_1a0,*local_1a0);
      auVar4 = psllw(auVar4,ZEXT416(2));
      local_208 = auVar4._0_8_;
      (*local_1c0)[0] = local_208;
    }
    else {
      auVar4 = phaddw(*local_1a0,local_1a0[1]);
      auVar4 = psllw(auVar4,ZEXT416(2));
      local_228 = auVar4._0_8_;
      lStack_220 = auVar4._8_8_;
      (*local_1c0)[0] = local_228;
      (*local_1c0)[1] = lStack_220;
      if (in_ECX == 0x20) {
        auVar4 = phaddw(local_1a0[2],local_1a0[3]);
        auVar4 = psllw(auVar4,ZEXT416(2));
        local_258 = auVar4._0_8_;
        lStack_250 = auVar4._8_8_;
        local_1c0[1][0] = local_258;
        local_1c0[1][1] = lStack_250;
      }
    }
    local_1c0 = local_1c0 + 4;
    local_1a0 = (undefined1 (*) [16])(*local_1a0 + (long)iVar3 * 2);
  } while (local_1c0 < palVar2);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_422_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + height * CFL_BUF_LINE_I128;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i sum = _mm_slli_epi16(_mm_hadd_epi16(top, top), 2);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      if (width == 8) {
        const __m128i sum = _mm_slli_epi16(_mm_hadd_epi16(top, top), 2);
        _mm_storel_epi64(pred_buf_m128i, sum);
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i sum = _mm_slli_epi16(_mm_hadd_epi16(top, top_1), 2);
        _mm_storeu_si128(pred_buf_m128i, sum);
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i sum_1 = _mm_slli_epi16(_mm_hadd_epi16(top_2, top_3), 2);
          _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
        }
      }
    }
    pred_buf_m128i += CFL_BUF_LINE_I128;
    input += input_stride;
  } while (pred_buf_m128i < end);
}